

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O0

REF_STATUS
ref_iso_boomray(char *filename,REF_GRID ref_grid,REF_DBL *field,REF_INT ldim,char **scalar_names,
               REF_DBL *segment0,REF_DBL *segment1)

{
  uint uVar1;
  FILE *__stream;
  REF_INT *sorted_index;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT *order;
  REF_INT *pRStack_d8;
  REF_INT i;
  REF_INT *source;
  int local_c8;
  REF_INT n;
  REF_INT local_n;
  REF_INT node;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_DBL *t;
  REF_DBL *xyzf;
  REF_DBL *local_xyzf;
  REF_DBL *ray_field;
  REF_GRID ray_grid;
  REF_DBL dt [3];
  double local_68;
  REF_DBL ds [3];
  FILE *file;
  REF_DBL *segment0_local;
  char **scalar_names_local;
  REF_INT ldim_local;
  REF_DBL *field_local;
  REF_GRID ref_grid_local;
  char *filename_local;
  
  _local_n = ref_grid->mpi;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x37d,
           "ref_iso_boomray","unable to open file");
    filename_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"tecplot refine gather\"\n");
    fprintf(__stream,"variables = \"x\" \"y\" \"z\"");
    if (scalar_names == (char **)0x0) {
      for (order._4_4_ = 0; order._4_4_ < ldim; order._4_4_ = order._4_4_ + 1) {
        fprintf(__stream," \"V%d\"",(ulong)(order._4_4_ + 1));
      }
    }
    else {
      for (order._4_4_ = 0; order._4_4_ < ldim; order._4_4_ = order._4_4_ + 1) {
        fprintf(__stream," \"%s\"",scalar_names[order._4_4_]);
      }
    }
    fprintf(__stream,"\n");
    for (order._4_4_ = 0; order._4_4_ < 3; order._4_4_ = order._4_4_ + 1) {
      ds[(long)order._4_4_ + -1] = segment1[order._4_4_] - segment0[order._4_4_];
    }
    filename_local._4_4_ = ref_math_normalize(&local_68);
    if (filename_local._4_4_ == 0) {
      filename_local._4_4_ =
           ref_iso_cast((REF_GRID *)&ray_field,&local_xyzf,ref_grid,field,ldim,segment0,segment1);
      if (filename_local._4_4_ == 0) {
        ref_mpi = (REF_MPI)ray_field[1];
        local_c8 = 0;
        for (n = 0; n < ref_mpi->id; n = n + 1) {
          if ((((-1 < n) && (n < ref_mpi->id)) &&
              (-1 < *(long *)((long)ref_mpi->comm + (long)n * 8))) &&
             (*(int *)((long)ref_mpi[1].start_time + 4) ==
              *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)n * 4))) {
            local_c8 = local_c8 + 1;
          }
        }
        if (local_c8 * (ldim + 3) < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 0x393,"ref_iso_boomray","malloc local_xyzf of REF_DBL negative");
          filename_local._4_4_ = 1;
        }
        else {
          xyzf = (REF_DBL *)malloc((long)(local_c8 * (ldim + 3)) << 3);
          if (xyzf == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x393,"ref_iso_boomray","malloc local_xyzf of REF_DBL NULL");
            filename_local._4_4_ = 2;
          }
          else {
            local_c8 = 0;
            for (n = 0; n < ref_mpi->id; n = n + 1) {
              if (((-1 < n) && (n < ref_mpi->id)) &&
                 ((-1 < *(long *)((long)ref_mpi->comm + (long)n * 8) &&
                  (*(int *)((long)ref_mpi[1].start_time + 4) ==
                   *(int *)(*(long *)&ref_mpi->native_alltoallv + (long)n * 4))))) {
                for (order._4_4_ = 0; order._4_4_ < 3; order._4_4_ = order._4_4_ + 1) {
                  xyzf[order._4_4_ + (ldim + 3) * local_c8] =
                       *(REF_DBL *)(*(long *)(ref_mpi + 1) + (long)(order._4_4_ + n * 0xf) * 8);
                }
                for (order._4_4_ = 0; order._4_4_ < ldim; order._4_4_ = order._4_4_ + 1) {
                  xyzf[order._4_4_ + 3 + (ldim + 3) * local_c8] = local_xyzf[order._4_4_ + n * ldim]
                  ;
                }
                local_c8 = local_c8 + 1;
              }
            }
            if (local_xyzf != (REF_DBL *)0x0) {
              free(local_xyzf);
            }
            ref_grid_free((REF_GRID)ray_field);
            filename_local._4_4_ =
                 ref_mpi_allconcat(_local_n,ldim + 3,local_c8,xyzf,(REF_INT *)((long)&source + 4),
                                   &stack0xffffffffffffff28,&t,3);
            if (filename_local._4_4_ == 0) {
              if (xyzf != (REF_DBL *)0x0) {
                free(xyzf);
              }
              if (_local_n->id == 0) {
                if (pRStack_d8 != (REF_INT *)0x0) {
                  free(pRStack_d8);
                }
                if (source._4_4_ < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x3a7,"ref_iso_boomray","malloc t of REF_DBL negative");
                  return 1;
                }
                ref_node = (REF_NODE)malloc((long)source._4_4_ << 3);
                if (ref_node == (REF_NODE)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x3a7,"ref_iso_boomray","malloc t of REF_DBL NULL");
                  return 2;
                }
                for (n = 0; n < source._4_4_; n = n + 1) {
                  for (order._4_4_ = 0; order._4_4_ < 3; order._4_4_ = order._4_4_ + 1) {
                    dt[(long)order._4_4_ + -1] =
                         t[order._4_4_ + (ldim + 3) * n] - segment0[order._4_4_];
                  }
                  *(double *)(&ref_node->n + (long)n * 2) =
                       dt[1] * ds[1] + (double)ray_grid * local_68 + dt[0] * ds[0];
                }
                if (source._4_4_ < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x3ad,"ref_iso_boomray","malloc order of REF_INT negative");
                  return 1;
                }
                sorted_index = (REF_INT *)malloc((long)source._4_4_ << 2);
                if (sorted_index == (REF_INT *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x3ad,"ref_iso_boomray","malloc order of REF_INT NULL");
                  return 2;
                }
                uVar1 = ref_sort_heap_dbl(source._4_4_,(REF_DBL *)ref_node,sorted_index);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x3ae,"ref_iso_boomray",(ulong)uVar1,"sort t");
                  return uVar1;
                }
                fprintf(__stream," zone t=\"((%.2f,%.2f,%.2f),(%.2f,%.2f,%.2f))\"\n",*segment0,
                        segment0[1],segment0[2],*segment1,segment1[1],segment1[2]);
                for (n = 0; n < source._4_4_; n = n + 1) {
                  for (order._4_4_ = 0; order._4_4_ < ldim + 3; order._4_4_ = order._4_4_ + 1) {
                    fprintf(__stream," %.15e",t[order._4_4_ + (ldim + 3) * sorted_index[n]]);
                  }
                  fprintf(__stream,"\n");
                }
                if (sorted_index != (REF_INT *)0x0) {
                  free(sorted_index);
                }
                if (ref_node != (REF_NODE)0x0) {
                  free(ref_node);
                }
                if (t != (REF_DBL *)0x0) {
                  free(t);
                }
              }
              filename_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,0x3a3,"ref_iso_boomray",(ulong)filename_local._4_4_,"concat");
            }
          }
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x38b
               ,"ref_iso_boomray",(ulong)filename_local._4_4_,"cast");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x387,
             "ref_iso_boomray",(ulong)filename_local._4_4_,"segment unit vector");
    }
  }
  return filename_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_iso_boomray(const char *filename, REF_GRID ref_grid,
                                   REF_DBL *field, REF_INT ldim,
                                   const char **scalar_names, REF_DBL *segment0,
                                   REF_DBL *segment1) {
  FILE *file;
  REF_DBL ds[3], dt[3];
  REF_GRID ray_grid;
  REF_DBL *ray_field;
  REF_DBL *local_xyzf, *xyzf, *t;
  REF_NODE ref_node;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node, local_n, n, *source, i, *order;
  file = fopen(filename, "w");
  if (NULL == file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");
  fprintf(file, "title=\"tecplot refine gather\"\n");
  fprintf(file, "variables = \"x\" \"y\" \"z\"");
  if (NULL != scalar_names) {
    for (i = 0; i < ldim; i++) fprintf(file, " \"%s\"", scalar_names[i]);
  } else {
    for (i = 0; i < ldim; i++) fprintf(file, " \"V%d\"", i + 1);
  }
  fprintf(file, "\n");
  for (i = 0; i < 3; i++) ds[i] = segment1[i] - segment0[i];
  RSS(ref_math_normalize(ds), "segment unit vector");

  RSS(ref_iso_cast(&ray_grid, &ray_field, ref_grid, field, ldim, segment0,
                   segment1),
      "cast");
  ref_node = ref_grid_node(ray_grid);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      local_n++;
    }
  }
  ref_malloc(local_xyzf, local_n * (3 + ldim), REF_DBL);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      for (i = 0; i < 3; i++)
        local_xyzf[i + (3 + ldim) * local_n] = ref_node_xyz(ref_node, i, node);
      for (i = 0; i < ldim; i++)
        local_xyzf[3 + i + (3 + ldim) * local_n] = ray_field[i + node * ldim];
      local_n++;
    }
  }
  ref_free(ray_field);
  ref_grid_free(ray_grid);

  RSS(ref_mpi_allconcat(ref_mpi, 3 + ldim, local_n, local_xyzf, &n, &source,
                        (void **)(&xyzf), REF_DBL_TYPE),
      "concat");
  ref_free(local_xyzf);
  if (ref_mpi_once(ref_mpi)) {
    ref_free(source);
    ref_malloc(t, n, REF_DBL);

    for (node = 0; node < n; node++) {
      for (i = 0; i < 3; i++) dt[i] = xyzf[i + (3 + ldim) * node] - segment0[i];
      t[node] = ref_math_dot(dt, ds);
    }
    ref_malloc(order, n, REF_INT);
    RSS(ref_sort_heap_dbl(n, t, order), "sort t");
    fprintf(file, " zone t=\"((%.2f,%.2f,%.2f),(%.2f,%.2f,%.2f))\"\n",
            segment0[0], segment0[1], segment0[2], segment1[0], segment1[1],
            segment1[2]);
    for (node = 0; node < n; node++) {
      for (i = 0; i < 3 + ldim; i++) {
        fprintf(file, " %.15e", xyzf[i + (3 + ldim) * order[node]]);
      }
      fprintf(file, "\n");
    }
    ref_free(order);
    ref_free(t);
    ref_free(xyzf);
  }
  return REF_SUCCESS;
}